

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

void idr_resolve(idr *idr,_func_void_uchar_ptr_int *fsetnum)

{
  char *pcVar1;
  idrent *piVar2;
  int iVar3;
  isoent *piVar4;
  int iVar5;
  idr *self;
  
  self = idr;
  while (self = (idr *)(self->wait_list).first, self != (idr *)0x0) {
    iVar3 = idr->num_size;
    piVar4 = *(isoent **)&self->pool_size;
    iVar5 = self->null_size;
    if (iVar5 + iVar3 != piVar4->ext_off) {
      memmove(piVar4->identifier + (long)iVar5 + (long)iVar3,piVar4->identifier + piVar4->ext_off,
              (long)piVar4->ext_len + (long)idr->null_size);
      iVar5 = self->null_size;
      piVar4 = *(isoent **)&self->pool_size;
      piVar4->ext_off = iVar5 + iVar3;
      piVar4->id_len = iVar5 + iVar3 + piVar4->ext_len;
    }
    pcVar1 = piVar4->identifier;
    do {
      piVar2 = (idrent *)(self->wait_list).last;
      iVar3 = piVar2->rename_num;
      piVar2->rename_num = iVar3 + 1;
      (*fsetnum)((uchar *)(pcVar1 + iVar5),iVar3);
      iVar3 = __archive_rb_tree_insert_node(&idr->rbtree,(archive_rb_node *)self);
    } while (iVar3 == 0);
  }
  return;
}

Assistant:

static void
idr_resolve(struct idr *idr, void (*fsetnum)(unsigned char *p, int num))
{
	struct idrent *n;
	unsigned char *p;

	for (n = idr->wait_list.first; n != NULL; n = n->wnext) {
		idr_extend_identifier(n, idr->num_size, idr->null_size);
		p = (unsigned char *)n->isoent->identifier + n->noff;
		do {
			fsetnum(p, n->avail->rename_num++);
		} while (!__archive_rb_tree_insert_node(
		    &(idr->rbtree), &(n->rbnode)));
	}
}